

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::updateDirtyRegions(QMdiSubWindowPrivate *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  _Base_ptr local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&(this->super_QWidgetPrivate).field_0x10 != 0) {
    QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::detach
              (&this->operationMap);
    p_Var2 = *(_Base_ptr *)
              ((long)&(((this->operationMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::detach
              (&this->operationMap);
    p_Var3 = &(((this->operationMap).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        getRegion((QMdiSubWindowPrivate *)&local_30,(Operation)this);
        p_Var1 = p_Var2[1]._M_left;
        p_Var2[1]._M_left = local_30;
        local_30 = p_Var1;
        QRegion::~QRegion((QRegion *)&local_30);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateDirtyRegions()
{
    // No update necessary
    if (!parent)
        return;

    for (OperationInfoMap::iterator it = operationMap.begin(), end = operationMap.end(); it != end; ++it)
        it.value().region = getRegion(it.key());
}